

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void qtree_bitins(uchar *a,int nx,int ny,int *b,int n,int bit)

{
  uint uVar1;
  int iVar2;
  int plane_val;
  int s00;
  int k;
  int j;
  int i;
  int bit_local;
  int n_local;
  int *b_local;
  int ny_local;
  int nx_local;
  uchar *a_local;
  
  uVar1 = 1 << ((byte)bit & 0x1f);
  k = 0;
  for (i = 0; i < nx + -1; i = i + 2) {
    s00 = n * i;
    for (j = 0; j < ny + -1; j = j + 2) {
      switch(a[k]) {
      case '\0':
        break;
      case '\x01':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        break;
      case '\x02':
        b[s00 + n] = uVar1 | b[s00 + n];
        break;
      case '\x03':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00 + n] = uVar1 | b[s00 + n];
        break;
      case '\x04':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\x05':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\x06':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\a':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\b':
        b[s00] = uVar1 | b[s00];
        break;
      case '\t':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00] = uVar1 | b[s00];
        break;
      case '\n':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00] = uVar1 | b[s00];
        break;
      case '\v':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00] = uVar1 | b[s00];
        break;
      case '\f':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
        break;
      case '\r':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0e':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0f':
        iVar2 = s00 + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
      }
      s00 = s00 + 2;
      k = k + 1;
    }
    if (j < ny) {
      switch(a[k]) {
      case '\0':
        break;
      case '\x01':
        break;
      case '\x02':
        b[s00 + n] = uVar1 | b[s00 + n];
        break;
      case '\x03':
        b[s00 + n] = uVar1 | b[s00 + n];
        break;
      case '\x04':
        break;
      case '\x05':
        break;
      case '\x06':
        b[s00 + n] = uVar1 | b[s00 + n];
        break;
      case '\a':
        b[s00 + n] = uVar1 | b[s00 + n];
        break;
      case '\b':
        b[s00] = uVar1 | b[s00];
        break;
      case '\t':
        b[s00] = uVar1 | b[s00];
        break;
      case '\n':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00] = uVar1 | b[s00];
        break;
      case '\v':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00] = uVar1 | b[s00];
        break;
      case '\f':
        b[s00] = uVar1 | b[s00];
        break;
      case '\r':
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0e':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0f':
        b[s00 + n] = uVar1 | b[s00 + n];
        b[s00] = uVar1 | b[s00];
      }
      k = k + 1;
    }
  }
  if (i < nx) {
    s00 = n * i;
    for (j = 0; j < ny + -1; j = j + 2) {
      switch(a[k]) {
      case '\0':
        break;
      case '\x01':
        break;
      case '\x02':
        break;
      case '\x03':
        break;
      case '\x04':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\x05':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\x06':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\a':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        break;
      case '\b':
        b[s00] = uVar1 | b[s00];
        break;
      case '\t':
        b[s00] = uVar1 | b[s00];
        break;
      case '\n':
        b[s00] = uVar1 | b[s00];
        break;
      case '\v':
        b[s00] = uVar1 | b[s00];
        break;
      case '\f':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
        break;
      case '\r':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0e':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0f':
        b[s00 + 1] = uVar1 | b[s00 + 1];
        b[s00] = uVar1 | b[s00];
      }
      s00 = s00 + 2;
      k = k + 1;
    }
    if (j < ny) {
      switch(a[k]) {
      case '\0':
        break;
      case '\x01':
        break;
      case '\x02':
        break;
      case '\x03':
        break;
      case '\x04':
        break;
      case '\x05':
        break;
      case '\x06':
        break;
      case '\a':
        break;
      case '\b':
        b[s00] = uVar1 | b[s00];
        break;
      case '\t':
        b[s00] = uVar1 | b[s00];
        break;
      case '\n':
        b[s00] = uVar1 | b[s00];
        break;
      case '\v':
        b[s00] = uVar1 | b[s00];
        break;
      case '\f':
        b[s00] = uVar1 | b[s00];
        break;
      case '\r':
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0e':
        b[s00] = uVar1 | b[s00];
        break;
      case '\x0f':
        b[s00] = uVar1 | b[s00];
      }
    }
  }
  return;
}

Assistant:

static void
qtree_bitins(unsigned char a[], int nx, int ny, int b[], int n, int bit)
/*
   int n;		declared y dimension of b
*/
{
int i, j, k;
int s00;
int plane_val;

	plane_val = 1 << bit;
	
	/*
	 * expand each 2x2 block
	 */
	k = 0;						/* k   is index of a[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;				/* s00 is index of b[i,j]	*/

  /* Note:
     this code appears to run very slightly faster on a 32-bit linux
     machine using s00+n rather than the s10 intermediate variable
  */
  /*		s10 = s00+n;	*/			/* s10 is index of b[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			b[s00+n+1] |= plane_val;
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00+n+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10+1] |= ( a[k]     & 1) << bit;
			b[s10  ] |= ((a[k]>>1) & 1) << bit;
			b[s00+1] |= ((a[k]>>2) & 1) << bit;
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/
			s00 += 2;
/*			s10 += 2; */
			k += 1;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			break;
		    case(7):
			b[s00+n  ] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10  ] |= ((a[k]>>1) & 1) << bit;
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00+1] |= ((a[k]>>2) & 1) << bit;
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/

			s00 += 2;
			k += 1;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			break;
		    case(7):
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/
			k += 1;
		}
	}
}